

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void __thiscall
pugi::impl::anon_unknown_0::xpath_node_set_raw::push_back_grow
          (xpath_node_set_raw *this,xpath_node *node,xpath_allocator *alloc)

{
  long lVar1;
  xml_attribute_struct *pxVar2;
  xpath_node *pxVar3;
  size_t old_size;
  
  old_size = (long)this->_eos - (long)this->_begin;
  lVar1 = ((long)old_size >> 4) + 1U + ((ulong)((long)old_size >> 4) >> 1);
  pxVar3 = (xpath_node *)xpath_allocator::reallocate(alloc,this->_begin,old_size,lVar1 * 0x10);
  if (pxVar3 != (xpath_node *)0x0) {
    this->_begin = pxVar3;
    this->_eos = pxVar3 + lVar1;
    this->_end = (xpath_node *)((long)pxVar3 + old_size + 0x10);
    pxVar2 = (node->_attribute)._attr;
    *(undefined8 *)((long)pxVar3 + old_size) = (node->_node)._root;
    ((undefined8 *)((long)pxVar3 + old_size))[1] = pxVar2;
  }
  return;
}

Assistant:

PUGI__FN_NO_INLINE void xpath_node_set_raw::push_back_grow(const xpath_node& node, xpath_allocator* alloc)
	{
		size_t capacity = static_cast<size_t>(_eos - _begin);

		// get new capacity (1.5x rule)
		size_t new_capacity = capacity + capacity / 2 + 1;

		// reallocate the old array or allocate a new one
		xpath_node* data = static_cast<xpath_node*>(alloc->reallocate(_begin, capacity * sizeof(xpath_node), new_capacity * sizeof(xpath_node)));
		if (!data) return;

		// finalize
		_begin = data;
		_end = data + capacity;
		_eos = data + new_capacity;

		// push
		*_end++ = node;
	}